

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O1

err_t SetParent(nodetree *p,nodetree *Parent,nodetree *Before)

{
  nodetree *pnVar1;
  err_t eVar2;
  
  if ((Before != (nodetree *)0x0) && (Before->Parent != Parent)) {
    __assert_fail("!Before || Before->Parent == Parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                  ,0xf,"err_t SetParent(nodetree *, nodetree *, nodetree *)");
  }
  if ((p == Before) || ((pnVar1 = p->Parent, pnVar1 == Parent && (p->Next == Before)))) {
    eVar2 = 0;
  }
  else {
    if (pnVar1 != (nodetree *)0x0) {
      (**(code **)((long)(pnVar1->Base).VMT + 0x58))(pnVar1,p);
    }
    if (Parent == (nodetree *)0x0) {
      eVar2 = 0;
    }
    else {
      eVar2 = (**(code **)((long)(Parent->Base).VMT + 0x50))(Parent,p,Before);
    }
    if (p->Next == p) {
      __assert_fail("p->Next != p",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                    ,0x18,"err_t SetParent(nodetree *, nodetree *, nodetree *)");
    }
  }
  return eVar2;
}

Assistant:

static NOINLINE err_t SetParent(nodetree* p,nodetree* Parent,nodetree* Before)
{
    err_t Result = ERR_NONE;

    assert(!Before || Before->Parent == Parent); // make sure Before is in the right tree

	if (p!=Before && (p->Parent != Parent || p->Next != Before))
    {
	    if (p->Parent)
            VMT_FUNC(p->Parent,nodetree_vmt)->RemoveChild(p->Parent,p);

	    if (Parent)
            Result = VMT_FUNC(Parent,nodetree_vmt)->AddChild(Parent,p,Before);
        assert(p->Next != p);
    }
    return Result;
}